

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O3

int light_update_option(light_pcapng section,light_pcapng pcapng,light_option option)

{
  ushort uVar1;
  light_boolean lVar2;
  uint32_t *__dest;
  uint uVar3;
  int iVar4;
  light_pcapng p_Var5;
  
  p_Var5 = pcapng;
  do {
    p_Var5 = (light_pcapng)p_Var5->options;
    if (p_Var5 == (light_pcapng)0x0) {
      iVar4 = light_add_option(section,pcapng,option,LIGHT_TRUE);
      return iVar4;
    }
  } while ((uint16_t)p_Var5->block_type != option->custom_option_code);
  uVar1 = *(uint16_t *)((long)&p_Var5->block_type + 2);
  if (uVar1 == option->option_length) {
    __dest = p_Var5->block_body;
  }
  else {
    uVar3 = option->option_length + 3 & 0xfffc;
    iVar4 = uVar3 - (uVar1 + 3 & 0xfffc);
    pcapng->block_total_lenght = pcapng->block_total_lenght + iVar4;
    lVar2 = __is_section_header(section);
    if (lVar2 == LIGHT_TRUE) {
      *(long *)(section->block_body + 2) = *(long *)(section->block_body + 2) + (long)iVar4;
    }
    else {
      light_update_option_cold_1();
    }
    *(uint16_t *)((long)&p_Var5->block_type + 2) = option->option_length;
    free(p_Var5->block_body);
    __dest = (uint32_t *)calloc((ulong)uVar3,1);
    p_Var5->block_body = __dest;
    uVar1 = *(uint16_t *)((long)&p_Var5->block_type + 2);
  }
  memcpy(__dest,option->data,(ulong)uVar1);
  return 0;
}

Assistant:

int light_update_option(light_pcapng section, light_pcapng pcapng, light_option option)
{
	light_option iterator = pcapng->options;
	uint16_t old_data_size, new_data_size;

	while (iterator != NULL) {
		if (iterator->custom_option_code == option->custom_option_code) {
			break;
		}
		iterator = iterator->next_option;
	}

	if (iterator == NULL) {
		return light_add_option(section, pcapng, option, LIGHT_TRUE);
	}

	if (iterator->option_length != option->option_length) {
		PADD32(option->option_length, &new_data_size);
		PADD32(iterator->option_length, &old_data_size);

		int data_size_diff = (int)new_data_size - (int)old_data_size;
		pcapng->block_total_lenght += data_size_diff;

		if (__is_section_header(section) == 1) {
			struct _light_section_header *shb = (struct _light_section_header *)section->block_body;
			shb->section_length += data_size_diff;
		}
		else {
			PCAPNG_WARNING("PCAPNG block is not section header!");
		}

		iterator->option_length = option->option_length;
		free(iterator->data);
		iterator->data = calloc(new_data_size, sizeof(uint8_t));
	}

	memcpy(iterator->data, option->data, iterator->option_length);

	return LIGHT_SUCCESS;
}